

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultApu.cpp
# Opt level: O0

void __thiscall trackerboy::DefaultApu::Private::Private(Private *this)

{
  Private *this_local;
  
  this->mNr51 = '\0';
  this->mLeftVolume = '\x01';
  this->mRightVolume = '\x01';
  apu::Mixer::Mixer(&this->mMixer);
  apu::Hardware::Hardware(&this->mHardware);
  this->mCycletime = 0;
  this->mEnabled = false;
  this->mVolumeStep = 0.0;
  setVolume(this,1.0);
  return;
}

Assistant:

Private() :
        mNr51(0),
        mLeftVolume(1),
        mRightVolume(1),
        mMixer(),
        mHardware(),
        mCycletime(0),
        mEnabled(false),
        mVolumeStep(0.0f)
    {
        setVolume(1.0f);
    }